

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O3

void * mi_expand(void *p,size_t newsize)

{
  ulong uVar1;
  long lVar2;
  mi_block_t *block;
  
  if (p == (void *)0x0) {
    p = (void *)0x0;
  }
  else {
    uVar1 = (long)p - 1U & 0xfffffffffe000000;
    if ((long)uVar1 < 1) {
      uVar1 = 0;
    }
    else {
      lVar2 = ((long)p - uVar1 >> 0x10) * 0x60;
      lVar2 = (uVar1 + lVar2) - (ulong)*(uint *)(uVar1 + 0x124 + lVar2);
      if ((*(byte *)(lVar2 + 0x12e) & 2) == 0) {
        uVar1 = *(ulong *)(lVar2 + 0x148);
      }
      else {
        uVar1 = mi_page_usable_aligned_size_of((mi_page_t *)(lVar2 + 0x120),p);
      }
    }
    if (uVar1 < newsize) {
      p = (void *)0x0;
    }
  }
  return p;
}

Assistant:

void* mi_expand(void* p, size_t newsize) mi_attr_noexcept {
  #if MI_PADDING
  // we do not shrink/expand with padding enabled
  MI_UNUSED(p); MI_UNUSED(newsize);
  return NULL;
  #else
  if (p == NULL) return NULL;
  const size_t size = _mi_usable_size(p,"mi_expand");
  if (newsize > size) return NULL;
  return p; // it fits
  #endif
}